

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  string *in_stack_00000030;
  string *in_stack_00000050;
  allocator local_59;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Inherited logger used:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"query",&local_21);
  QueryHandler2(in_stack_00000050);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  poVar1 = std::operator<<((ostream *)&std::cerr,"New logger used:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"another query",&local_59);
  QueryHandler1(in_stack_00000030);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return 0;
}

Assistant:

int main() {
  std::cerr << "Inherited logger used:" << std::endl;
  QueryHandler2("query");
  std::cerr << "New logger used:" << std::endl;
  QueryHandler1("another query");
}